

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O1

Value __thiscall lsim::StringProperty::value_as_lsim_value(StringProperty *this)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  Value VVar4;
  long lVar5;
  int idx;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  pcVar1 = (this->m_value)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->m_value)._M_string_length);
  plVar2 = local_40;
  if (local_38 != 0) {
    lVar5 = 0;
    do {
      iVar3 = tolower((int)*(char *)((long)plVar2 + lVar5));
      *(char *)((long)plVar2 + lVar5) = (char)iVar3;
      lVar5 = lVar5 + 1;
    } while (local_38 != lVar5);
  }
  lVar5 = 0;
  do {
    iVar3 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar3 == 0) goto LAB_00110ad5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 4;
LAB_00110ad5:
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  VVar4 = VALUE_ERROR;
  if ((Value)lVar5 < VALUE_ERROR) {
    VVar4 = (Value)lVar5;
  }
  return VVar4;
}

Assistant:

Property::uptr_t ValueProperty::clone() const {
    return make_property(key(), m_value);
}